

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_a_star.cpp
# Opt level: O3

void __thiscall
IDAStarSearch::extend_frontier(IDAStarSearch *this,shared_ptr<Node> *node,int max_value)

{
  int iVar1;
  element_type *peVar2;
  int iVar3;
  bool bVar4;
  iterator iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int new_y;
  int new_x;
  undefined1 local_5d;
  int local_5c;
  int new_value;
  int new_cost;
  shared_ptr<Node> local_50;
  deque<std::shared_ptr<Node>,std::allocator<std::shared_ptr<Node>>> *local_40;
  IDAStarSearch *local_38;
  
  local_40 = (deque<std::shared_ptr<Node>,std::allocator<std::shared_ptr<Node>>> *)&this->frontier;
  lVar8 = 0;
  local_5c = max_value;
  local_38 = this;
  do {
    peVar2 = (node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    new_x = peVar2->x + *(int *)((long)&DAT_00105060 + lVar8);
    new_y = peVar2->y + *(int *)((long)&DAT_00105070 + lVar8);
    bVar4 = Maze::is_valid_coordinate(&(this->super_Search).maze,new_x,new_y);
    if (bVar4) {
      local_50.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = new_y;
      local_50.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = new_x;
      iVar5 = std::
              _Hashtable<std::pair<int,_int>,_std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<int,_int>_>,_PointHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(this->super_Search).visited_points._M_h,(key_type *)&local_50);
      if (iVar5.super__Node_iterator_base<std::pair<int,_int>,_true>._M_cur == (__node_type *)0x0) {
        iVar1 = (((node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->field_4).
                disc_cost;
        new_cost = iVar1 + 1;
        iVar6 = new_x - (local_38->super_Search).target.first;
        iVar3 = -iVar6;
        if (0 < iVar6) {
          iVar3 = iVar6;
        }
        iVar7 = new_y - (local_38->super_Search).target.second;
        iVar6 = -iVar7;
        if (0 < iVar7) {
          iVar6 = iVar7;
        }
        new_value = iVar6 + iVar1 + iVar3 + 1;
        if (new_value <= local_5c) {
          local_50.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
          ;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<Node,std::allocator<Node>,std::shared_ptr<Node>&,int&,int&,int&,int&>
                    (&local_50.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (Node **)&local_50,(allocator<Node> *)&local_5d,node,&new_x,&new_y,&new_value,
                     &new_cost);
          std::deque<std::shared_ptr<Node>,std::allocator<std::shared_ptr<Node>>>::
          emplace_back<std::shared_ptr<Node>>(local_40,&local_50);
          if (local_50.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_50.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
          }
        }
      }
    }
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x10);
  return;
}

Assistant:

void IDAStarSearch::extend_frontier(shared_ptr<Node> node, int max_value) {
    // right, left, down, up
    const int delta_xs[] = {0, 0, 1, -1};
    const int delta_ys[] = {1, -1, 0, 0};
    for (int i = 0; i < 4; ++i) {
        auto dx = delta_xs[i];
        auto dy = delta_ys[i];
        int new_x = node->x + dx;
        int new_y = node->y + dy;
        if (not maze.is_valid_coordinate(new_x, new_y)) continue;
        if (visited_points.find(make_pair(new_x, new_y)) != visited_points.end()) continue;
        auto new_cost = node->disc_cost + 1;
        auto new_value = get_evaluation(new_x, new_y, new_cost);
        if (new_value <= max_value) frontier.emplace_back(make_shared<Node>(node, new_x, new_y, new_value, new_cost));
    }
}